

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O3

void injection::InjectionManager::bind_singleton<ITest,Test1>(void)

{
  function<ITest_*()> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object =
       injection_private::simple_maker<Test1>;
  local_28._M_invoker = std::_Function_handler<ITest_*(),_Test1_*(*)()>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<ITest_*(),_Test1_*(*)()>::_M_manager;
  bind<ITest>(&local_28,SINGLETON);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

static void bind_singleton() {
        bind<I>(injection_private::simple_maker<C>, InjectionScope::SINGLETON);
    }